

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O3

BN * gcdBinary(BN *__return_storage_ptr__,BN *a,BN *b)

{
  bool bVar1;
  size_t shift;
  size_t shift_00;
  size_t shift_01;
  BN *pBVar2;
  BN __tmp;
  BN local_48;
  
  bVar1 = BN::is0(a);
  pBVar2 = b;
  if ((!bVar1) && (bVar1 = BN::is0(b), pBVar2 = a, !bVar1)) {
    shift = BN::countzeroright(a);
    shift_00 = BN::countzeroright(b);
    BN::operator>>=(a,shift);
    BN::operator>>=(b,shift_00);
    bVar1 = BN::operator<(a,b);
    if (bVar1) {
      BN::BN(&local_48,a);
      BN::operator=(a,b);
      BN::operator=(b,&local_48);
      if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    while (bVar1 = BN::is0(a), !bVar1) {
      bVar1 = BN::operator>=(a,b);
      if (bVar1) {
        BN::operator-=(a,b);
        pBVar2 = a;
      }
      else {
        BN::operator-=(b,a);
        pBVar2 = b;
      }
      shift_01 = BN::countzeroright(pBVar2);
      BN::operator>>=(pBVar2,shift_01);
    }
    if (shift_00 < shift) {
      shift = shift_00;
    }
    pBVar2 = BN::operator<<=(b,shift);
  }
  BN::BN(__return_storage_ptr__,pBVar2);
  return __return_storage_ptr__;
}

Assistant:

BN gcdBinary(BN a,BN b)
{
    if(a.is0())
        return b;

    if(b.is0())
        return a;

    size_t acount = a.countzeroright();
    size_t bcount = b.countzeroright();

    a >>= acount;
    b >>= bcount;

    // TODO why swap(a, b) is faster than a.swap(b) ?
    if(a < b)
        swap(a, b);

    while(!a.is0()) {
        if(a >= b) {
            a -= b;
            a >>= a.countzeroright();
        } else {
            b -= a;
            b >>= b.countzeroright();
        }
    }
    return move(b <<= min(acount,bcount));
}